

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O2

int __thiscall gl3cts::ClipDistance::Tests::init(Tests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  CoverageTest *this_00;
  FunctionalTest *this_01;
  TestNode *node;
  
  this_00 = (CoverageTest *)operator_new(0x80);
  CoverageTest::CoverageTest(this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (FunctionalTest *)operator_new(0x80);
  ClipDistance::FunctionalTest::FunctionalTest(this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  node = (TestNode *)operator_new(0x78);
  NegativeTest::NegativeTest((NegativeTest *)node,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,node);
  return extraout_EAX;
}

Assistant:

void gl3cts::ClipDistance::Tests::init()
{
	addChild(new gl3cts::ClipDistance::CoverageTest(m_context));
	addChild(new gl3cts::ClipDistance::FunctionalTest(m_context));
	addChild(new gl3cts::ClipDistance::NegativeTest(m_context));
}